

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O2

__m256i * highbd_comp_mask_pred_line_avx2
                    (__m256i *__return_storage_ptr__,__m256i s0,__m256i s1,__m256i a)

{
  undefined1 auVar1 [32];
  __m256i *in_RAX;
  undefined1 auVar2 [32];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  undefined1 in_YMM2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  
  auVar2._8_2_ = 0x40;
  auVar2._0_8_ = 0x40004000400040;
  auVar2._10_2_ = 0x40;
  auVar2._12_2_ = 0x40;
  auVar2._14_2_ = 0x40;
  auVar2._16_2_ = 0x40;
  auVar2._18_2_ = 0x40;
  auVar2._20_2_ = 0x40;
  auVar2._22_2_ = 0x40;
  auVar2._24_2_ = 0x40;
  auVar2._26_2_ = 0x40;
  auVar2._28_2_ = 0x40;
  auVar2._30_2_ = 0x40;
  auVar1 = vpsubw_avx2(auVar2,in_YMM2);
  auVar2 = vpunpcklwd_avx2(in_ZMM0._0_32_,in_ZMM1._0_32_);
  auVar3 = vpunpcklwd_avx2(in_YMM2,auVar1);
  auVar2 = vpmaddwd_avx2(auVar2,auVar3);
  auVar4._8_4_ = 0x20;
  auVar4._0_8_ = 0x2000000020;
  auVar4._12_4_ = 0x20;
  auVar4._16_4_ = 0x20;
  auVar4._20_4_ = 0x20;
  auVar4._24_4_ = 0x20;
  auVar4._28_4_ = 0x20;
  auVar2 = vpaddd_avx2(auVar2,auVar4);
  auVar3 = vpsrad_avx2(auVar2,6);
  auVar2 = vpunpckhwd_avx2(in_ZMM0._0_32_,in_ZMM1._0_32_);
  auVar1 = vpunpckhwd_avx2(in_YMM2,auVar1);
  auVar2 = vpmaddwd_avx2(auVar2,auVar1);
  auVar2 = vpaddd_avx2(auVar2,auVar4);
  auVar2 = vpsrad_avx2(auVar2,6);
  vpackssdw_avx2(auVar3,auVar2);
  return in_RAX;
}

Assistant:

static inline __m256i highbd_comp_mask_pred_line_avx2(const __m256i s0,
                                                      const __m256i s1,
                                                      const __m256i a) {
  const __m256i alpha_max = _mm256_set1_epi16((1 << AOM_BLEND_A64_ROUND_BITS));
  const __m256i round_const =
      _mm256_set1_epi32((1 << AOM_BLEND_A64_ROUND_BITS) >> 1);
  const __m256i a_inv = _mm256_sub_epi16(alpha_max, a);

  const __m256i s_lo = _mm256_unpacklo_epi16(s0, s1);
  const __m256i a_lo = _mm256_unpacklo_epi16(a, a_inv);
  const __m256i pred_lo = _mm256_madd_epi16(s_lo, a_lo);
  const __m256i pred_l = _mm256_srai_epi32(
      _mm256_add_epi32(pred_lo, round_const), AOM_BLEND_A64_ROUND_BITS);

  const __m256i s_hi = _mm256_unpackhi_epi16(s0, s1);
  const __m256i a_hi = _mm256_unpackhi_epi16(a, a_inv);
  const __m256i pred_hi = _mm256_madd_epi16(s_hi, a_hi);
  const __m256i pred_h = _mm256_srai_epi32(
      _mm256_add_epi32(pred_hi, round_const), AOM_BLEND_A64_ROUND_BITS);

  const __m256i comp = _mm256_packs_epi32(pred_l, pred_h);

  return comp;
}